

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ProcessTests(cmCTest *this)

{
  bool bVar1;
  int iVar2;
  cmCTestGenericHandler *pcVar3;
  ulong uVar4;
  ostream *this_00;
  char *pcVar5;
  double dVar6;
  string local_2c0 [32];
  ostringstream local_2a0 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string fullname;
  char *file;
  unsigned_long kk;
  Directory d;
  string notes_dir;
  string local_a8;
  string local_88;
  allocator local_51;
  string local_50;
  cmCTestGenericHandler *local_30;
  cmCTestGenericHandler *uphandler;
  Part p;
  int update_count;
  bool notest;
  cmCTest *pcStack_18;
  int res;
  cmCTest *this_local;
  
  update_count = 0;
  uphandler._4_4_ = 0;
  uphandler._0_4_ = 0;
  p._3_1_ = 1;
  pcStack_18 = this;
  while (p._3_1_ != PartStart >> 0x18 && (uint)uphandler != 0xb) {
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + (uint)uphandler);
    uphandler._0_4_ = (uint)uphandler + 1;
    p._3_1_ = (bVar1 ^ 0xff) & 1;
  }
  bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 1);
  if ((bVar1) && (dVar6 = GetRemainingTimeAllowed(this), 0.0 < dVar6 - 120.0)) {
    pcVar3 = GetHandler(this,"update");
    local_30 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"SourceDirectory",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a8,"SourceDirectory",
               (allocator *)(notes_dir.field_2._M_local_buf + 0xf));
    GetCTestConfiguration(&local_88,this,&local_a8);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetPersistentOption(pcVar3,&local_50,pcVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(notes_dir.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    uphandler._4_4_ = (*(local_30->super_cmObject)._vptr_cmObject[5])();
    if (uphandler._4_4_ < 0) {
      update_count = update_count | 1;
    }
  }
  if ((this->TestModel == 2) && (uphandler._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 2);
    if ((bVar1) && (dVar6 = GetRemainingTimeAllowed(this), 0.0 < dVar6 - 120.0)) {
      pcVar3 = GetHandler(this,"configure");
      iVar2 = (*(pcVar3->super_cmObject)._vptr_cmObject[5])();
      if (iVar2 < 0) {
        update_count = update_count | 2;
      }
    }
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 3);
    if ((bVar1) && (dVar6 = GetRemainingTimeAllowed(this), 0.0 < dVar6 - 120.0)) {
      UpdateCTestConfiguration(this);
      pcVar3 = GetHandler(this,"build");
      iVar2 = (*(pcVar3->super_cmObject)._vptr_cmObject[5])();
      if (iVar2 < 0) {
        update_count = update_count | 4;
      }
    }
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 4);
    if (((bVar1) || ((p._3_1_ & 1) != PartStart >> 0x18)) &&
       (dVar6 = GetRemainingTimeAllowed(this), 0.0 < dVar6 - 120.0)) {
      UpdateCTestConfiguration(this);
      pcVar3 = GetHandler(this,"test");
      iVar2 = (*(pcVar3->super_cmObject)._vptr_cmObject[5])();
      if (iVar2 < 0) {
        update_count = update_count | 8;
      }
    }
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 5);
    if ((bVar1) && (dVar6 = GetRemainingTimeAllowed(this), 0.0 < dVar6 - 120.0)) {
      UpdateCTestConfiguration(this);
      pcVar3 = GetHandler(this,"coverage");
      iVar2 = (*(pcVar3->super_cmObject)._vptr_cmObject[5])();
      if (iVar2 < 0) {
        update_count = update_count | 0x20;
      }
    }
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 6);
    if ((bVar1) && (dVar6 = GetRemainingTimeAllowed(this), 0.0 < dVar6 - 120.0)) {
      UpdateCTestConfiguration(this);
      pcVar3 = GetHandler(this,"memcheck");
      iVar2 = (*(pcVar3->super_cmObject)._vptr_cmObject[5])();
      if (iVar2 < 0) {
        update_count = update_count | 0x10;
      }
    }
    if ((p._3_1_ & 1) == PartStart >> 0x18) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                     &this->BinaryDir,"/Testing/Notes");
      bVar1 = cmsys::SystemTools::FileIsDirectory
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d);
      if (bVar1) {
        cmsys::Directory::Directory((Directory *)&kk);
        cmsys::Directory::Load((Directory *)&kk,(string *)&d);
        for (file = (char *)0x0;
            pcVar5 = (char *)cmsys::Directory::GetNumberOfFiles((Directory *)&kk), file < pcVar5;
            file = file + 1) {
          fullname.field_2._8_8_ = cmsys::Directory::GetFile((Directory *)&kk,(unsigned_long)file);
          std::operator+(&local_128,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,"/"
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_128,(char *)fullname.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_128);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::SystemTools::FileExists(pcVar5);
          if ((bVar1) && (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_108), !bVar1))
          {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::__cxx11::string::operator+=((string *)&this->NotesFiles,";");
            }
            std::__cxx11::string::operator+=((string *)&this->NotesFiles,(string *)local_108);
            PartInfo::Enable(this->Parts + 8);
          }
          std::__cxx11::string::~string((string *)local_108);
        }
        cmsys::Directory::~Directory((Directory *)&kk);
      }
      std::__cxx11::string::~string((string *)&d);
    }
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 8);
    if (bVar1) {
      UpdateCTestConfiguration(this);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        pcVar5 = (char *)std::__cxx11::string::c_str();
        GenerateNotesFile(this,pcVar5);
      }
    }
    bVar1 = PartInfo::operator_cast_to_bool(this->Parts + 7);
    if (bVar1) {
      UpdateCTestConfiguration(this);
      pcVar3 = GetHandler(this,"submit");
      iVar2 = (*(pcVar3->super_cmObject)._vptr_cmObject[5])();
      if (iVar2 < 0) {
        update_count = update_count | 0x40;
      }
    }
    if (update_count != 0) {
      std::__cxx11::ostringstream::ostringstream(local_2a0);
      this_00 = std::operator<<((ostream *)local_2a0,"Errors while running CTest");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x46c,pcVar5,false);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::ostringstream::~ostringstream(local_2a0);
    }
    this_local._4_4_ = update_count;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTest::ProcessTests()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for(Part p = PartStart; notest && p != PartCount; p = Part(p+1))
    {
    notest = !this->Parts[p];
    }
  if (this->Parts[PartUpdate] &&
      (this->GetRemainingTimeAllowed() - 120 > 0))
    {
    cmCTestGenericHandler* uphandler = this->GetHandler("update");
    uphandler->SetPersistentOption("SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if ( update_count < 0 )
      {
      res |= cmCTest::UPDATE_ERRORS;
      }
    }
  if ( this->TestModel == cmCTest::CONTINUOUS && !update_count )
    {
    return 0;
    }
  if (this->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() - 120 > 0))
    {
    if (this->GetHandler("configure")->ProcessHandler() < 0)
      {
      res |= cmCTest::CONFIGURE_ERRORS;
      }
    }
  if (this->Parts[PartBuild] &&
      (this->GetRemainingTimeAllowed() - 120 > 0))
    {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("build")->ProcessHandler() < 0)
      {
      res |= cmCTest::BUILD_ERRORS;
      }
    }
  if ((this->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() - 120 > 0))
    {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("test")->ProcessHandler() < 0)
      {
      res |= cmCTest::TEST_ERRORS;
      }
    }
  if (this->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() - 120 > 0))
    {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("coverage")->ProcessHandler() < 0)
      {
      res |= cmCTest::COVERAGE_ERRORS;
      }
    }
  if (this->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() - 120 > 0))
    {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("memcheck")->ProcessHandler() < 0)
      {
      res |= cmCTest::MEMORY_ERRORS;
      }
    }
  if ( !notest )
    {
    std::string notes_dir = this->BinaryDir + "/Testing/Notes";
    if ( cmSystemTools::FileIsDirectory(notes_dir) )
      {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for ( kk = 0; kk < d.GetNumberOfFiles(); kk ++ )
        {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if ( cmSystemTools::FileExists(fullname.c_str()) &&
          !cmSystemTools::FileIsDirectory(fullname) )
          {
          if (!this->NotesFiles.empty())
            {
            this->NotesFiles += ";";
            }
          this->NotesFiles += fullname;
          this->Parts[PartNotes].Enable();
          }
        }
      }
    }
  if (this->Parts[PartNotes])
    {
    this->UpdateCTestConfiguration();
    if (!this->NotesFiles.empty())
      {
      this->GenerateNotesFile(this->NotesFiles.c_str());
      }
    }
  if (this->Parts[PartSubmit])
    {
    this->UpdateCTestConfiguration();
    if (this->GetHandler("submit")->ProcessHandler() < 0)
      {
      res |= cmCTest::SUBMIT_ERRORS;
      }
    }
  if ( res != 0 )
    {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest"
                 << std::endl);
    }
  return res;
}